

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

int __thiscall P_QReset::match(P_QReset *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  reference pvVar1;
  value_type_conflict local_1c;
  vector<StateP,_std::allocator<StateP>_> *local_18;
  vector<StateP,_std::allocator<StateP>_> *stk_local;
  P_QReset *this_local;
  
  local_18 = stk;
  stk_local = (vector<StateP,_std::allocator<StateP>_> *)this;
  pvVar1 = std::vector<StateP,_std::allocator<StateP>_>::back(stk);
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::push_back(&(pvVar1->st).qcount,&local_1c);
  pvVar1 = std::vector<StateP,_std::allocator<StateP>_>::back(local_18);
  pvVar1->iseq = pvVar1->iseq + 1;
  return 0;
}

Assistant:

int P_QReset::match(vector<StateP> &stk) {
    stk.back().st.qcount.push_back(0);
    stk.back().iseq++;
    return 0;
}